

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

void __thiscall
bssl::VerifyNameMatchUnicodeConversionTest_UnicodeConversionsAreEqual_Test::
~VerifyNameMatchUnicodeConversionTest_UnicodeConversionsAreEqual_Test
          (VerifyNameMatchUnicodeConversionTest_UnicodeConversionsAreEqual_Test *this)

{
  VerifyNameMatchUnicodeConversionTest_UnicodeConversionsAreEqual_Test *this_local;
  
  ~VerifyNameMatchUnicodeConversionTest_UnicodeConversionsAreEqual_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(VerifyNameMatchUnicodeConversionTest, UnicodeConversionsAreEqual) {
  std::string der_1;
  ASSERT_TRUE(LoadTestData(prefix(), value_type_1(), "unmangled", &der_1));
  std::string der_2;
  ASSERT_TRUE(LoadTestData(prefix(), value_type_2(), "unmangled", &der_2));
  EXPECT_TRUE(VerifyNameMatch(SequenceValueFromString(der_1),
                              SequenceValueFromString(der_2)));
}